

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

int name2id(name_map *map,int max,char *name)

{
  int iVar1;
  long lVar2;
  
  if (0 < max) {
    lVar2 = 0;
    do {
      iVar1 = strcmp(*(char **)((long)&map->name + lVar2),name);
      if (iVar1 == 0) {
        return *(int *)((long)&map->id + lVar2);
      }
      lVar2 = lVar2 + 0x10;
    } while ((ulong)(uint)max << 4 != lVar2);
  }
  return -1;
}

Assistant:

int name2id(name_map* map, int max, const char *name)
{
	int i;

	for (i = 0; i < max; i++) {
		if (!strcmp(map[i].name, name)) {
			return map[i].id;
		}
	}

	// nothing match
	return -1;
}